

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O3

void __thiscall QAction::setToolTip(QAction *this,QString *tooltip)

{
  QActionPrivate *this_00;
  long lVar1;
  char cVar2;
  QStringView QVar3;
  QStringView QVar4;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  lVar1 = (this_00->tooltip).d.size;
  if (lVar1 == (tooltip->d).size) {
    QVar3.m_data = (this_00->tooltip).d.ptr;
    QVar3.m_size = lVar1;
    QVar4.m_data = (tooltip->d).ptr;
    QVar4.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar3,QVar4);
    if (cVar2 != '\0') {
      return;
    }
  }
  QString::operator=(&this_00->tooltip,(QString *)tooltip);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setToolTip(const QString &tooltip)
{
    Q_D(QAction);
    if (d->tooltip == tooltip)
        return;

    d->tooltip = tooltip;
    d->sendDataChanged();
}